

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BitIdx.h
# Opt level: O1

size_t axl::sl::getAllocSize<4096ul>(size_t size)

{
  ulong uVar1;
  
  if (size < 0x1000) {
    uVar1 = size - 1 >> 1 | size - 1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = uVar1 >> 0x10 | uVar1;
    return (uVar1 >> 0x20 | uVar1) + 1;
  }
  return size + 0xfff & 0xfffffffffffff000;
}

Assistant:

size_t
getAllocSize(size_t size) {
	ASSERT(isPowerOf2(growLimit));
	return size < growLimit ? getPowerOf2Ge(size) : align<growLimit> (size);
}